

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCof.c
# Opt level: O2

Cof_Man_t * Cof_ManCreateLogicSimple(Gia_Man_t *pGia)

{
  uint uVar1;
  uint *puVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  Cof_Man_t *pCVar6;
  Vec_Int_t *pVVar7;
  Vec_Int_t *pVVar8;
  int *piVar9;
  Gia_Obj_t *pGVar10;
  ulong uVar11;
  int *__ptr;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  Vec_Int_t *p;
  uint Entry;
  long lVar15;
  int iVar16;
  int local_64;
  
  pCVar6 = (Cof_Man_t *)calloc(1,0x48);
  pCVar6->pGia = pGia;
  pVVar7 = Vec_IntAlloc(pGia->vCis->nSize);
  pCVar6->vCis = pVVar7;
  pVVar8 = Vec_IntAlloc(pGia->vCos->nSize);
  pCVar6->vCos = pVVar8;
  iVar16 = pGia->vCos->nSize;
  uVar1 = pGia->nObjs * 10 + iVar16 * 2 + ~(pGia->vCis->nSize + iVar16) * 4;
  pCVar6->nObjData = uVar1;
  piVar9 = (int *)calloc((long)(int)uVar1,4);
  pCVar6->pObjData = piVar9;
  if (pGia->pRefs != (int *)0x0) {
    free(pGia->pRefs);
    pGia->pRefs = (int *)0x0;
  }
  Gia_ManCreateRefs(pGia);
  local_64 = 0;
  iVar16 = 0;
  uVar11 = 0;
  do {
    Entry = (uint)uVar11;
    if ((pGia->nObjs <= iVar16) || (pGVar10 = Gia_ManObj(pGia,iVar16), pGVar10 == (Gia_Obj_t *)0x0))
    {
      if (Entry != uVar1) {
        __assert_fail("iHandle == p->nObjData",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaCof.c"
                      ,0xb4,"Cof_Man_t *Cof_ManCreateLogicSimple(Gia_Man_t *)");
      }
      __ptr = Gia_ManCreateMuxRefs(pGia);
      lVar15 = 0;
      while ((lVar15 < pGia->nObjs &&
             (pGVar10 = Gia_ManObj(pGia,(int)lVar15), pGVar10 != (Gia_Obj_t *)0x0))) {
        uVar11 = (ulong)pGVar10->Value;
        if ((uint)piVar9[uVar11] >> 8 != piVar9[uVar11 + 2]) {
          __assert_fail("pObjLog->nFanouts == pObjLog->Value",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaCof.c"
                        ,0xb9,"Cof_Man_t *Cof_ManCreateLogicSimple(Gia_Man_t *)");
        }
        piVar9[uVar11 + 1] = __ptr[lVar15];
        lVar15 = lVar15 + 1;
      }
      free(__ptr);
      return pCVar6;
    }
    pGVar10->Value = Entry;
    lVar15 = uVar11 * 4;
    puVar2 = (uint *)(piVar9 + uVar11);
    *(byte *)(piVar9 + uVar11) = *(byte *)(piVar9 + uVar11) & 0xf;
    iVar3 = Gia_ObjRefNum(pGia,pGVar10);
    uVar5 = piVar9[uVar11];
    uVar12 = uVar5 & 0xff | iVar3 << 8;
    piVar9[uVar11] = uVar12;
    piVar9[uVar11 + 3] = iVar16;
    piVar9[uVar11 + 2] = 0;
    uVar4 = (uint)*(ulong *)pGVar10;
    uVar14 = *(ulong *)pGVar10 & 0x1fffffff;
    if (uVar14 == 0x1fffffff || (int)uVar4 < 0) {
      if ((int)uVar4 < 0 && (int)uVar14 != 0x1fffffff) {
        uVar13 = (ulong)pGVar10[-uVar14].Value;
        uVar14 = (ulong)(uVar5 >> 2 & 0x3c);
        uVar5 = (uint)(lVar15 + uVar13 * -4 >> 2) & 0x7fffffff;
        *(uint *)((long)puVar2 + uVar14 + 0x18) =
             *(uint *)((long)puVar2 + uVar14 + 0x18) & 0x80000000 | uVar5;
        iVar3 = piVar9[uVar13 + 2];
        piVar9[uVar13 + 2] = iVar3 + 1;
        uVar14 = (ulong)(((uint)piVar9[uVar13] >> 4 & 0xf) + iVar3);
        piVar9[uVar13 + uVar14 + 6] = piVar9[uVar13 + uVar14 + 6] & 0x80000000U | uVar5;
        uVar5 = piVar9[uVar11];
        uVar14 = (ulong)(uVar5 >> 2 & 0x3c);
        *(uint *)((long)puVar2 + uVar14 + 0x18) =
             (*(uint *)((long)puVar2 + uVar14 + 0x18) & 0x7fffffff) +
             (*(uint *)pGVar10 & 0xe0000000) * 4;
        piVar9[uVar11] = (uVar5 + 0x10 & 0xf0) + (uVar5 & 0xffffff0e) + 1;
        p = pVVar8;
      }
      else {
        if ((~uVar4 & 0x9fffffff) != 0) goto LAB_005430f9;
        *puVar2 = uVar12 | 1;
        p = pVVar7;
      }
      Vec_IntPush(p,Entry);
    }
    else {
      uVar13 = (ulong)pGVar10[-uVar14].Value;
      uVar14 = (ulong)(uVar5 >> 2 & 0x3c);
      uVar5 = (uint)(lVar15 + uVar13 * -4 >> 2) & 0x7fffffff;
      *(uint *)((long)puVar2 + uVar14 + 0x18) =
           *(uint *)((long)puVar2 + uVar14 + 0x18) & 0x80000000 | uVar5;
      iVar3 = piVar9[uVar13 + 2];
      piVar9[uVar13 + 2] = iVar3 + 1;
      uVar14 = (ulong)(((uint)piVar9[uVar13] >> 4 & 0xf) + iVar3);
      piVar9[uVar13 + uVar14 + 6] = piVar9[uVar13 + uVar14 + 6] & 0x80000000U | uVar5;
      uVar5 = piVar9[uVar11];
      uVar4 = *(uint *)pGVar10;
      piVar9[uVar11] = uVar5 & 0xffffff0f | uVar5 + 0x10 & 0xf0;
      uVar14 = (ulong)(uVar5 >> 2 & 0x3c);
      *(uint *)((long)puVar2 + uVar14 + 0x18) =
           (*(uint *)((long)puVar2 + uVar14 + 0x18) & 0x7fffffff) + (uVar4 & 0xe0000000) * 4;
      uVar13 = (ulong)pGVar10[-(ulong)(*(uint *)&pGVar10->field_0x4 & 0x1fffffff)].Value;
      uVar14 = (ulong)(uVar5 + 0x10 >> 2 & 0x3c);
      uVar5 = (uint)(lVar15 + uVar13 * -4 >> 2) & 0x7fffffff;
      *(uint *)((long)puVar2 + uVar14 + 0x18) =
           *(uint *)((long)puVar2 + uVar14 + 0x18) & 0x80000000 | uVar5;
      iVar3 = piVar9[uVar13 + 2];
      piVar9[uVar13 + 2] = iVar3 + 1;
      uVar14 = (ulong)(((uint)piVar9[uVar13] >> 4 & 0xf) + iVar3);
      piVar9[uVar13 + uVar14 + 6] = piVar9[uVar13 + uVar14 + 6] & 0x80000000U | uVar5;
      uVar5 = piVar9[uVar11];
      uVar14 = *(ulong *)pGVar10;
      piVar9[uVar11] = uVar5 & 0xffffff0f | uVar5 + 0x10 & 0xf0;
      uVar11 = (ulong)(uVar5 >> 2 & 0x3c);
      *(uint *)((long)puVar2 + uVar11 + 0x18) =
           *(uint *)((long)puVar2 + uVar11 + 0x18) & 0x7fffffff |
           (uint)(uVar14 >> 0x1e) & 0x80000000;
      pCVar6->nNodes = pCVar6->nNodes + 1;
      local_64 = pCVar6->nObjs;
    }
LAB_005430f9:
    uVar11 = (ulong)(Entry + (*puVar2 >> 8) + (*puVar2 >> 4 & 0xf) + 6);
    local_64 = local_64 + 1;
    pCVar6->nObjs = local_64;
    iVar16 = iVar16 + 1;
  } while( true );
}

Assistant:

Cof_Man_t * Cof_ManCreateLogicSimple( Gia_Man_t * pGia )
{
    Cof_Man_t * p;
    Cof_Obj_t * pObjLog, * pFanLog;
    Gia_Obj_t * pObj;
    int * pMuxRefs;
    int i, iHandle = 0;
    p = ABC_CALLOC( Cof_Man_t, 1 );
    p->pGia = pGia;
    p->vCis = Vec_IntAlloc( Gia_ManCiNum(pGia) );
    p->vCos = Vec_IntAlloc( Gia_ManCoNum(pGia) );
    p->nObjData = (sizeof(Cof_Obj_t) / 4) * Gia_ManObjNum(pGia) + 4 * Gia_ManAndNum(pGia) + 2 * Gia_ManCoNum(pGia);
    p->pObjData = ABC_CALLOC( int, p->nObjData );
    ABC_FREE( pGia->pRefs );
    Gia_ManCreateRefs( pGia );
    Gia_ManForEachObj( pGia, pObj, i )
    {
        pObj->Value = iHandle;
        pObjLog = Cof_ManObj( p, iHandle );
        pObjLog->nFanins  = 0;
        pObjLog->nFanouts = Gia_ObjRefNum( pGia, pObj );
        pObjLog->Id       = i;
        pObjLog->Value    = 0;
        if ( Gia_ObjIsAnd(pObj) )
        {
            pFanLog = Cof_ManObj( p, Gia_ObjHandle(Gia_ObjFanin0(pObj)) ); 
            pFanLog->Fanios[pFanLog->nFanins + pFanLog->Value++].iFan = 
                pObjLog->Fanios[pObjLog->nFanins].iFan = Cof_ObjHandleDiff( pObjLog, pFanLog );
            pObjLog->Fanios[pObjLog->nFanins++].fCompl = Gia_ObjFaninC0(pObj);

            pFanLog = Cof_ManObj( p, Gia_ObjHandle(Gia_ObjFanin1(pObj)) ); 
            pFanLog->Fanios[pFanLog->nFanins + pFanLog->Value++].iFan = 
                pObjLog->Fanios[pObjLog->nFanins].iFan = Cof_ObjHandleDiff( pObjLog, pFanLog );
            pObjLog->Fanios[pObjLog->nFanins++].fCompl = Gia_ObjFaninC1(pObj);
            p->nNodes++;
        }
        else if ( Gia_ObjIsCo(pObj) )
        {
            pFanLog = Cof_ManObj( p, Gia_ObjHandle(Gia_ObjFanin0(pObj)) ); 
            pFanLog->Fanios[pFanLog->nFanins + pFanLog->Value++].iFan = 
                pObjLog->Fanios[pObjLog->nFanins].iFan = Cof_ObjHandleDiff( pObjLog, pFanLog );
            pObjLog->Fanios[pObjLog->nFanins++].fCompl = Gia_ObjFaninC0(pObj);

            pObjLog->fTerm = 1;
            Vec_IntPush( p->vCos, iHandle );
        }
        else if ( Gia_ObjIsCi(pObj) )
        {
            pObjLog->fTerm = 1;
            Vec_IntPush( p->vCis, iHandle );
        }
        iHandle += Cof_ObjSize( pObjLog );
        p->nObjs++;
    }
    assert( iHandle == p->nObjData );
    pMuxRefs = Gia_ManCreateMuxRefs( pGia );
    Gia_ManForEachObj( pGia, pObj, i )
    {
        pObjLog = Cof_ManObj( p, Gia_ObjHandle(pObj) );
        assert( pObjLog->nFanouts == pObjLog->Value );
        pObjLog->nFanoutsM = pMuxRefs[i];
    }
    ABC_FREE( pMuxRefs );
    return p;
}